

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderIndexingTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::ShaderIndexingTests::init(ShaderIndexingTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  deUint32 dVar2;
  int iVar3;
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  uint uVar6;
  uint uVar7;
  uint number;
  int iVar8;
  DataType dataType;
  TestNode *pTVar9;
  char *pcVar10;
  long *plVar11;
  ShaderIndexingCase *pSVar12;
  size_t sVar13;
  ostream *poVar14;
  long *plVar15;
  size_type *psVar16;
  long lVar17;
  long lVar18;
  char *pcVar19;
  long lVar20;
  char *pcVar21;
  long lVar22;
  ShaderEvalFunc p_Var23;
  ostringstream *poVar24;
  long lVar25;
  long lVar26;
  code *evalFunc;
  DataType DVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  StringTemplate vertTemplate;
  _Alloc_hider local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  string vertexShaderSource;
  allocator<char> local_459;
  StringTemplate fragTemplate;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  string local_400;
  ulong local_3e0;
  long local_3d8;
  string desc;
  string name;
  uint local_390;
  uint local_370;
  long local_360;
  ostringstream vtx;
  long local_328;
  long lStack_320;
  ios_base local_2c8 [264];
  char *local_1c0;
  ostringstream frag;
  long local_1a8;
  long lStack_1a0;
  ios_base local_148 [264];
  long local_40;
  long local_38;
  
  pTVar9 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,pCVar1->m_testCtx,"varying_array","Varying array access tests."
            );
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  lVar17 = 0;
  do {
    DVar27 = Performance::ShaderOperatorTests::init()::floatTypes[lVar17];
    lVar25 = 0;
    do {
      lVar18 = 0x23;
      if (lVar25 == 2) {
        lVar18 = 0x1d;
      }
      pcVar19 = "\tfor (int i = 0; i < ui_four; i++)\n";
      if (lVar25 == 2) {
        pcVar19 = "\tfor (int i = 0; i < 4; i++)\n";
      }
      lVar20 = 0x1d;
      if (lVar25 == 1) {
        lVar20 = 0x37;
      }
      pcVar21 = "uniform mediump int ui_four;\n";
      if (lVar25 == 1) {
        pcVar21 = "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n";
      }
      local_3d8 = (&getIndexAccessTypeName(deqp::gles2::Functional::IndexAccessType)::s_names)
                  [lVar25];
      local_390 = (uint)lVar25 | 2;
      lVar26 = 0;
      local_3e0 = lVar25;
      do {
        pcVar10 = glu::getDataTypeName(DVar27);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fragTemplate,pcVar10,(allocator<char> *)&vertexShaderSource);
        plVar11 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
        params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        plVar15 = plVar11 + 2;
        if ((long *)*plVar11 == plVar15) {
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar11[3];
        }
        else {
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
          params._M_t._M_impl._0_8_ = (long *)*plVar11;
        }
        params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar11[1];
        *plVar11 = (long)plVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&params);
        vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
        psVar16 = (size_type *)(plVar11 + 2);
        if ((size_type *)*plVar11 == psVar16) {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
          vertTemplate.m_template.field_2._8_8_ = plVar11[3];
        }
        else {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
          vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
        }
        vertTemplate.m_template._M_string_length = plVar11[1];
        *plVar11 = (long)psVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
        _frag = &local_1a8;
        plVar15 = plVar11 + 2;
        if ((long *)*plVar11 == plVar15) {
          local_1a8 = *plVar15;
          lStack_1a0 = plVar11[3];
        }
        else {
          local_1a8 = *plVar15;
          _frag = (long *)*plVar11;
        }
        *plVar11 = (long)plVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
        _vtx = &local_328;
        plVar15 = plVar11 + 2;
        if ((long *)*plVar11 == plVar15) {
          local_328 = *plVar15;
          lStack_320 = plVar11[3];
        }
        else {
          local_328 = *plVar15;
          _vtx = (long *)*plVar11;
        }
        *plVar11 = (long)plVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar16 = (size_type *)(plVar11 + 2);
        if ((size_type *)*plVar11 == psVar16) {
          name.field_2._M_allocated_capacity = *psVar16;
          name.field_2._8_8_ = plVar11[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar16;
          name._M_dataplus._M_p = (pointer)*plVar11;
        }
        name._M_string_length = plVar11[1];
        *plVar11 = (long)psVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if (_vtx != &local_328) {
          operator_delete(_vtx,local_328 + 1);
        }
        if (_frag != &local_1a8) {
          operator_delete(_frag,local_1a8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
            &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)params._M_t._M_impl._0_8_,
                          (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
          operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                          fragTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        std::__cxx11::string::_M_construct<char_const*>((string *)&params,"Varying array with ","");
        plVar11 = (long *)std::__cxx11::string::append((char *)&params);
        vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
        psVar16 = (size_type *)(plVar11 + 2);
        if ((size_type *)*plVar11 == psVar16) {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
          vertTemplate.m_template.field_2._8_8_ = plVar11[3];
        }
        else {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
          vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
        }
        vertTemplate.m_template._M_string_length = plVar11[1];
        *plVar11 = (long)psVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
        _frag = &local_1a8;
        plVar15 = plVar11 + 2;
        if ((long *)*plVar11 == plVar15) {
          local_1a8 = *plVar15;
          lStack_1a0 = plVar11[3];
        }
        else {
          local_1a8 = *plVar15;
          _frag = (long *)*plVar11;
        }
        *plVar11 = (long)plVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
        _vtx = &local_328;
        plVar15 = plVar11 + 2;
        if ((long *)*plVar11 == plVar15) {
          local_328 = *plVar15;
          lStack_320 = plVar11[3];
        }
        else {
          local_328 = *plVar15;
          _vtx = (long *)*plVar11;
        }
        *plVar11 = (long)plVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
        desc._M_dataplus._M_p = (pointer)&desc.field_2;
        psVar16 = (size_type *)(plVar11 + 2);
        if ((size_type *)*plVar11 == psVar16) {
          desc.field_2._M_allocated_capacity = *psVar16;
          desc.field_2._8_8_ = plVar11[3];
        }
        else {
          desc.field_2._M_allocated_capacity = *psVar16;
          desc._M_dataplus._M_p = (pointer)*plVar11;
        }
        desc._M_string_length = plVar11[1];
        *plVar11 = (long)psVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if (_vtx != &local_328) {
          operator_delete(_vtx,local_328 + 1);
        }
        if (_frag != &local_1a8) {
          operator_delete(_frag,local_1a8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
            &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)params._M_t._M_impl._0_8_,
                          (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        _Var5._M_p = name._M_dataplus._M_p;
        _Var4._M_p = desc._M_dataplus._M_p;
        pCVar1 = (this->super_TestCaseGroup).m_context;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"attribute highp vec4 a_position;\n",0x21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"attribute highp vec4 a_coords;\n",0x1f);
        if (local_390 == 3) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,pcVar21,lVar20);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"varying ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n",0x34);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"void main()\n",0xc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"\tgl_Position = a_position;\n",0x1b);
        if (local_3e0 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tvar[0] = ${VAR_TYPE}(a_coords);\n",0x21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tvar[1] = ${VAR_TYPE}(a_coords) * 0.5;\n",0x27);
          lVar25 = 0x29;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tvar[2] = ${VAR_TYPE}(a_coords) * 0.25;\n",0x28);
          pcVar10 = "\tvar[3] = ${VAR_TYPE}(a_coords) * 0.125;\n";
        }
        else if (local_3e0 == 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tvar[ui_zero]  = ${VAR_TYPE}(a_coords);\n",0x28);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tvar[ui_one]   = ${VAR_TYPE}(a_coords) * 0.5;\n",0x2e);
          lVar25 = 0x30;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tvar[ui_two]   = ${VAR_TYPE}(a_coords) * 0.25;\n",0x2f);
          pcVar10 = "\tvar[ui_three] = ${VAR_TYPE}(a_coords) * 0.125;\n";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n",
                     0x3a);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,pcVar19,lVar18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\t{\n",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\t\tvar[i] = ${VAR_TYPE}(coords);\n",0x20);
          lVar25 = 3;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\t\tcoords = coords * 0.5;\n",0x19);
          pcVar10 = "\t}\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,pcVar10,lVar25);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"}\n",2);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"precision mediump int;\n",0x17);
        lVar25 = 0x37;
        pcVar10 = "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n";
        if (lVar26 == 8) {
LAB_002e356c:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar10,lVar25);
        }
        else {
          lVar25 = 0x15;
          pcVar10 = "uniform int ui_four;\n";
          if (lVar26 == 0x18) goto LAB_002e356c;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"varying ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n",0x34);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"void main()\n",0xc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n",0x32);
        if (lVar26 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[0];\n",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[1];\n",0x10);
          lVar25 = 0x10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[2];\n",0x10);
          pcVar10 = "\tres += var[3];\n";
        }
        else if (lVar26 == 8) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[ui_zero];\n",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[ui_one];\n",0x15);
          lVar25 = 0x17;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[ui_two];\n",0x15);
          pcVar10 = "\tres += var[ui_three];\n";
        }
        else {
          pcVar10 = "\tfor (int i = 0; i < ui_four; i++)\n";
          if (lVar26 == 0x10) {
            pcVar10 = "\tfor (int i = 0; i < 4; i++)\n";
          }
          lVar22 = 0x23;
          if (lVar26 == 0x10) {
            lVar22 = 0x1d;
          }
          lVar25 = 0x11;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar10,lVar22);
          pcVar10 = "\t\tres += var[i];\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar10,lVar25);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"\tgl_FragColor = vec4(res${PADDING});\n",0x25);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
        params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &params._M_t._M_impl.super__Rb_tree_header._M_header;
        params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar27);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[9],_const_char_*,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [9])0x637a67,(char **)&fragTemplate);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_p != &local_498) {
          operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x63bdf8);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_p != &local_498) {
          operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])0x67040e,(char (*) [8])0x63a986);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_p != &local_498) {
          operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if (DVar27 == TYPE_FLOAT_VEC3) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x636b4d);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if (DVar27 == TYPE_FLOAT_VEC2) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x636b48);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if (DVar27 == TYPE_FLOAT) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0");
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [1])"");
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_p != &local_498) {
          operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                   (allocator<char> *)&local_400);
        tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
          operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                          fragTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
          operator_delete(vertexShaderSource._M_dataplus._M_p,
                          vertexShaderSource.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vertexShaderSource,local_400._M_dataplus._M_p,&local_459);
        tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
          operator_delete(vertexShaderSource._M_dataplus._M_p,
                          vertexShaderSource.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400._M_dataplus._M_p != &local_400.field_2) {
          operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
        }
        tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
        tcu::StringTemplate::specialize(&local_400,&fragTemplate,&params);
        if (DVar27 - TYPE_FLOAT < 4) {
          p_Var23 = (ShaderEvalFunc)(&PTR_evalArrayCoordsFloat_007737b0)[DVar27 - TYPE_FLOAT];
        }
        else {
          p_Var23 = (ShaderEvalFunc)0x0;
        }
        pSVar12 = (ShaderIndexingCase *)operator_new(0x130);
        uVar6 = (uint)(local_3e0 == 1 || lVar26 == 8);
        if (local_3e0 == 3) {
          uVar6 = 3;
        }
        dVar2 = uVar6 | 5;
        if (lVar26 != 0x18) {
          dVar2 = uVar6;
        }
        ShaderIndexingCase::ShaderIndexingCase
                  (pSVar12,pCVar1,_Var5._M_p,_Var4._M_p,true,DVar27,p_Var23,dVar2,
                   vertexShaderSource._M_dataplus._M_p,local_400._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400._M_dataplus._M_p != &local_400.field_2) {
          operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
          operator_delete(vertexShaderSource._M_dataplus._M_p,
                          vertexShaderSource.field_2._M_allocated_capacity + 1);
        }
        tcu::StringTemplate::~StringTemplate(&fragTemplate);
        tcu::StringTemplate::~StringTemplate(&vertTemplate);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&params._M_t);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
        std::ios_base::~ios_base(local_148);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
        std::ios_base::~ios_base(local_2c8);
        tcu::TestNode::addChild(pTVar9,(TestNode *)pSVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)desc._M_dataplus._M_p != &desc.field_2) {
          operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        lVar26 = lVar26 + 8;
      } while (lVar26 != 0x20);
      lVar25 = local_3e0 + 1;
    } while (lVar25 != 4);
    lVar17 = lVar17 + 1;
    if (lVar17 == 4) {
      pTVar9 = (TestNode *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,pCVar1->m_testCtx,"uniform_array",
                 "Uniform array access tests.");
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
      pTVar9[1]._vptr_TestNode = (_func_int **)pCVar1;
      tcu::TestNode::addChild((TestNode *)this,pTVar9);
      lVar17 = 0;
      do {
        local_3e0 = (ulong)Performance::ShaderOperatorTests::init()::floatTypes[lVar17];
        uVar6 = Performance::ShaderOperatorTests::init()::floatTypes[lVar17] - TYPE_FLOAT;
        lVar25 = 0;
        local_1c0 = (char *)lVar17;
        do {
          pcVar19 = "\tfor (int i = 0; i < ui_four; i++)\n";
          if (lVar25 == 2) {
            pcVar19 = "\tfor (int i = 0; i < 4; i++)\n";
          }
          lVar17 = 0x23;
          if (lVar25 == 2) {
            lVar17 = 0x1d;
          }
          bVar28 = lVar25 == 1;
          lVar18 = 0x1d;
          if (bVar28) {
            lVar18 = 0x37;
          }
          pcVar21 = "uniform mediump int ui_four;\n";
          if (bVar28) {
            pcVar21 = "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n";
          }
          bVar30 = true;
          local_370 = (uint)lVar25 | 2;
          lVar20 = 0;
          local_3d8 = lVar25;
          do {
            glu::getShaderTypeName
                      (UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices[lVar20]);
            pcVar10 = glu::getDataTypeName((DataType)local_3e0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&params,pcVar10,(allocator<char> *)&fragTemplate);
            plVar11 = (long *)std::__cxx11::string::append((char *)&params);
            vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
            psVar16 = (size_type *)(plVar11 + 2);
            if ((size_type *)*plVar11 == psVar16) {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
              vertTemplate.m_template.field_2._8_8_ = plVar11[3];
            }
            else {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
              vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
            }
            vertTemplate.m_template._M_string_length = plVar11[1];
            *plVar11 = (long)psVar16;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
            _frag = &local_1a8;
            plVar15 = plVar11 + 2;
            if ((long *)*plVar11 == plVar15) {
              local_1a8 = *plVar15;
              lStack_1a0 = plVar11[3];
            }
            else {
              local_1a8 = *plVar15;
              _frag = (long *)*plVar11;
            }
            *plVar11 = (long)plVar15;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
            _vtx = &local_328;
            plVar15 = plVar11 + 2;
            if ((long *)*plVar11 == plVar15) {
              local_328 = *plVar15;
              lStack_320 = plVar11[3];
            }
            else {
              local_328 = *plVar15;
              _vtx = (long *)*plVar11;
            }
            *plVar11 = (long)plVar15;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
            name._M_dataplus._M_p = (pointer)&name.field_2;
            psVar16 = (size_type *)(plVar11 + 2);
            if ((size_type *)*plVar11 == psVar16) {
              name.field_2._M_allocated_capacity = *psVar16;
              name.field_2._8_8_ = plVar11[3];
            }
            else {
              name.field_2._M_allocated_capacity = *psVar16;
              name._M_dataplus._M_p = (pointer)*plVar11;
            }
            name._M_string_length = plVar11[1];
            *plVar11 = (long)psVar16;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            if (_vtx != &local_328) {
              operator_delete(_vtx,local_328 + 1);
            }
            if (_frag != &local_1a8) {
              operator_delete(_frag,local_1a8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            params._M_t._M_impl._0_8_ =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&params,"Uniform array with ","");
            plVar11 = (long *)std::__cxx11::string::append((char *)&params);
            vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
            psVar16 = (size_type *)(plVar11 + 2);
            if ((size_type *)*plVar11 == psVar16) {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
              vertTemplate.m_template.field_2._8_8_ = plVar11[3];
            }
            else {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
              vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
            }
            vertTemplate.m_template._M_string_length = plVar11[1];
            *plVar11 = (long)psVar16;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
            _frag = &local_1a8;
            plVar15 = plVar11 + 2;
            if ((long *)*plVar11 == plVar15) {
              local_1a8 = *plVar15;
              lStack_1a0 = plVar11[3];
            }
            else {
              local_1a8 = *plVar15;
              _frag = (long *)*plVar11;
            }
            DVar27 = (DataType)local_3e0;
            *plVar11 = (long)plVar15;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
            _vtx = &local_328;
            plVar15 = plVar11 + 2;
            if ((long *)*plVar11 == plVar15) {
              local_328 = *plVar15;
              lStack_320 = plVar11[3];
            }
            else {
              local_328 = *plVar15;
              _vtx = (long *)*plVar11;
            }
            *plVar11 = (long)plVar15;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
            desc._M_dataplus._M_p = (pointer)&desc.field_2;
            psVar16 = (size_type *)(plVar11 + 2);
            if ((size_type *)*plVar11 == psVar16) {
              desc.field_2._M_allocated_capacity = *psVar16;
              desc.field_2._8_8_ = plVar11[3];
            }
            else {
              desc.field_2._M_allocated_capacity = *psVar16;
              desc._M_dataplus._M_p = (pointer)*plVar11;
            }
            desc._M_string_length = plVar11[1];
            *plVar11 = (long)psVar16;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            if (_vtx != &local_328) {
              operator_delete(_vtx,local_328 + 1);
            }
            if (_frag != &local_1a8) {
              operator_delete(_frag,local_1a8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            _Var5._M_p = name._M_dataplus._M_p;
            _Var4._M_p = desc._M_dataplus._M_p;
            pCVar1 = (this->super_TestCaseGroup).m_context;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
            poVar24 = (ostringstream *)&frag;
            if (bVar30) {
              poVar24 = (ostringstream *)&vtx;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&vtx,"attribute highp vec4 a_position;\n",0x21);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&vtx,"attribute highp vec4 a_coords;\n",0x1f);
            if (bVar30 == false) {
              lVar25 = 0x1f;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"varying mediump vec4 v_coords;\n",0x1f);
              pcVar10 = "varying mediump vec4 v_coords;\n";
              DVar27 = (DataType)local_3e0;
            }
            else {
              lVar25 = 0x1e;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"varying mediump vec4 v_color;\n",0x1e);
              pcVar10 = "varying mediump vec4 v_color;\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar10,lVar25);
            if (local_370 == 3) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar24,pcVar21,lVar18);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar24,"uniform ${PRECISION} ${VAR_TYPE} u_arr[${ARRAY_LEN}];\n",
                       0x36);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"void main()\n",0xc);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"{\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&vtx,"\tgl_Position = a_position;\n",0x1b);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"void main()\n",0xc)
            ;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar24,"\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n",
                       0x32);
            if (local_3d8 == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar24,"\tres += u_arr[0];\n",0x12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar24,"\tres += u_arr[1];\n",0x12);
              lVar25 = 0x12;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar24,"\tres += u_arr[2];\n",0x12);
              pcVar10 = "\tres += u_arr[3];\n";
            }
            else if (local_3d8 == 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar24,"\tres += u_arr[ui_zero];\n",0x18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar24,"\tres += u_arr[ui_one];\n",0x17);
              lVar25 = 0x19;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar24,"\tres += u_arr[ui_two];\n",0x17);
              pcVar10 = "\tres += u_arr[ui_three];\n";
            }
            else {
              lVar25 = 0x13;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar24,pcVar19,lVar17);
              pcVar10 = "\t\tres += u_arr[i];\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar24,pcVar10,lVar25);
            if (bVar30 == false) {
              lVar25 = 0x25;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"\tv_coords = a_coords;\n",0x16);
              pcVar10 = "\tgl_FragColor = vec4(res${PADDING});\n";
            }
            else {
              lVar25 = 0x19;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"\tv_color = vec4(res${PADDING});\n",0x20);
              pcVar10 = "\tgl_FragColor = v_color;\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar10,lVar25);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"}\n",2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
            params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header;
            params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar27);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[9],_const_char_*,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [9])0x637a67,(char **)&fragTemplate);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_p != &local_498) {
              operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x63bdf8);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_p != &local_498) {
              operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [10])0x67040e,(char (*) [8])0x63a986);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_p != &local_498) {
              operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if (DVar27 == TYPE_FLOAT_VEC3) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x636b4d);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            else if (DVar27 == TYPE_FLOAT_VEC2) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x636b48);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            else if (DVar27 == TYPE_FLOAT) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0");
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            else {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [1])"");
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_p != &local_498) {
              operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                       (allocator<char> *)&local_400);
            tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
              operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                              fragTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
              operator_delete(vertexShaderSource._M_dataplus._M_p,
                              vertexShaderSource.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vertexShaderSource,local_400._M_dataplus._M_p,&local_459);
            tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
              operator_delete(vertexShaderSource._M_dataplus._M_p,
                              vertexShaderSource.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_400._M_dataplus._M_p != &local_400.field_2) {
              operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1
                             );
            }
            tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
            tcu::StringTemplate::specialize(&local_400,&fragTemplate,&params);
            if (uVar6 < 4) {
              p_Var23 = (ShaderEvalFunc)(&PTR_evalArrayUniformFloat_00773790)[uVar6];
            }
            else {
              p_Var23 = (ShaderEvalFunc)0x0;
            }
            pSVar12 = (ShaderIndexingCase *)operator_new(0x130);
            dVar2 = ((byte)~bVar30 & 1) * 2 + 3;
            if (local_3d8 != 3) {
              dVar2 = (uint)bVar28;
            }
            ShaderIndexingCase::ShaderIndexingCase
                      (pSVar12,pCVar1,_Var5._M_p,_Var4._M_p,bVar30,DVar27,p_Var23,dVar2,
                       vertexShaderSource._M_dataplus._M_p,local_400._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_400._M_dataplus._M_p != &local_400.field_2) {
              operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
              operator_delete(vertexShaderSource._M_dataplus._M_p,
                              vertexShaderSource.field_2._M_allocated_capacity + 1);
            }
            tcu::StringTemplate::~StringTemplate(&fragTemplate);
            tcu::StringTemplate::~StringTemplate(&vertTemplate);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&params);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
            std::ios_base::~ios_base(local_148);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
            std::ios_base::~ios_base(local_2c8);
            tcu::TestNode::addChild(pTVar9,(TestNode *)pSVar12);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)desc._M_dataplus._M_p != &desc.field_2) {
              operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) {
              operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
            }
            lVar20 = 1;
            bVar29 = bVar30 != false;
            bVar30 = false;
          } while (bVar29);
          lVar25 = local_3d8 + 1;
        } while (lVar25 != 4);
        lVar17 = (long)local_1c0 + 1;
      } while (lVar17 != 4);
      pTVar9 = (TestNode *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,pCVar1->m_testCtx,"tmp_array",
                 "Temporary array access tests.");
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
      pTVar9[1]._vptr_TestNode = (_func_int **)pCVar1;
      tcu::TestNode::addChild((TestNode *)this,pTVar9);
      lVar17 = 0;
      do {
        DVar27 = Performance::ShaderOperatorTests::init()::floatTypes[lVar17];
        lVar25 = 0;
        local_40 = lVar17;
        do {
          local_1c0 = "\tfor (int i = 0; i < ui_four; i++)\n";
          if (lVar25 == 2) {
            local_1c0 = "\tfor (int i = 0; i < 4; i++)\n";
          }
          local_38 = 0x23;
          if (lVar25 == 2) {
            local_38 = 0x1d;
          }
          lVar17 = 0;
          do {
            pcVar19 = "\tfor (int i = 0; i < ui_four; i++)\n";
            if (lVar17 == 2) {
              pcVar19 = "\tfor (int i = 0; i < 4; i++)\n";
            }
            lVar18 = 0x23;
            if (lVar17 == 2) {
              lVar18 = 0x1d;
            }
            local_3e0 = (&getIndexAccessTypeName(deqp::gles2::Functional::IndexAccessType)::s_names)
                        [lVar17];
            local_3d8 = CONCAT44(local_3d8._4_4_,(uint)(lVar17 == 1 || lVar25 == 1));
            bVar28 = true;
            lVar20 = 0;
            do {
              glu::getShaderTypeName
                        (UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices[lVar20]);
              pcVar21 = glu::getDataTypeName(DVar27);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar21,(allocator<char> *)&local_400);
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                fragTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              fragTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&fragTemplate.m_template);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar11[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
                params._M_t._M_impl._0_8_ = (long *)*plVar11;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar11[1];
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                vertTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              vertTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              _frag = &local_1a8;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                local_1a8 = *plVar15;
                lStack_1a0 = plVar11[3];
              }
              else {
                local_1a8 = *plVar15;
                _frag = (long *)*plVar11;
              }
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
              _vtx = &local_328;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                local_328 = *plVar15;
                lStack_320 = plVar11[3];
              }
              else {
                local_328 = *plVar15;
                _vtx = (long *)*plVar11;
              }
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                name.field_2._M_allocated_capacity = *psVar16;
                name.field_2._8_8_ = plVar11[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar16;
                name._M_dataplus._M_p = (pointer)*plVar11;
              }
              name._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              if (_vtx != &local_328) {
                operator_delete(_vtx,local_328 + 1);
              }
              if (_frag != &local_1a8) {
                operator_delete(_frag,local_1a8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&vertexShaderSource,"Temporary array with ","");
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                fragTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              fragTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&fragTemplate.m_template);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar11[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
                params._M_t._M_impl._0_8_ = (long *)*plVar11;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar11[1];
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                vertTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              vertTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              _frag = &local_1a8;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                local_1a8 = *plVar15;
                lStack_1a0 = plVar11[3];
              }
              else {
                local_1a8 = *plVar15;
                _frag = (long *)*plVar11;
              }
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
              _vtx = &local_328;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                local_328 = *plVar15;
                lStack_320 = plVar11[3];
              }
              else {
                local_328 = *plVar15;
                _vtx = (long *)*plVar11;
              }
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                desc.field_2._M_allocated_capacity = *psVar16;
                desc.field_2._8_8_ = plVar11[3];
              }
              else {
                desc.field_2._M_allocated_capacity = *psVar16;
                desc._M_dataplus._M_p = (pointer)*plVar11;
              }
              desc._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              if (_vtx != &local_328) {
                operator_delete(_vtx,local_328 + 1);
              }
              if (_frag != &local_1a8) {
                operator_delete(_frag,local_1a8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              _Var5._M_p = name._M_dataplus._M_p;
              _Var4._M_p = desc._M_dataplus._M_p;
              pCVar1 = (this->super_TestCaseGroup).m_context;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              poVar24 = (ostringstream *)&frag;
              if (bVar28) {
                poVar24 = (ostringstream *)&vtx;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"attribute highp vec4 a_position;\n",0x21);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"attribute highp vec4 a_coords;\n",0x1f);
              if (bVar28 == false) {
                lVar20 = 0x1f;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"varying mediump vec4 v_coords;\n",0x1f);
                pcVar21 = "varying mediump vec4 v_coords;\n";
              }
              else {
                lVar20 = 0x1e;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"varying mediump vec4 v_color;\n",0x1e);
                pcVar21 = "varying mediump vec4 v_color;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar21,lVar20);
              if ((deUint32)local_3d8 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,
                           "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n",0x37);
              }
              if (lVar17 == 3 || lVar25 == 3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"uniform mediump int ui_four;\n",0x1d);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"void main()\n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"{\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"\tgl_Position = a_position;\n",0x1b);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"void main()\n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
              pcVar21 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";
              if (bVar28 != false) {
                pcVar21 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar24,pcVar21,0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar24,"\t${PRECISION} ${VAR_TYPE} arr[${ARRAY_LEN}];\n",0x2d);
              if (lVar25 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\tarr[0] = ${VAR_TYPE}(coords);\n",0x1f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\tarr[1] = ${VAR_TYPE}(coords) * 0.5;\n",0x25);
                lVar20 = 0x27;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\tarr[2] = ${VAR_TYPE}(coords) * 0.25;\n",0x26);
                pcVar21 = "\tarr[3] = ${VAR_TYPE}(coords) * 0.125;\n";
              }
              else if (lVar25 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\tarr[ui_zero]  = ${VAR_TYPE}(coords);\n",0x26);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\tarr[ui_one]   = ${VAR_TYPE}(coords) * 0.5;\n",0x2c)
                ;
                lVar20 = 0x2e;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\tarr[ui_two]   = ${VAR_TYPE}(coords) * 0.25;\n",0x2d
                          );
                pcVar21 = "\tarr[ui_three] = ${VAR_TYPE}(coords) * 0.125;\n";
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,local_1c0,local_38);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar24,"\t{\n",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\t\tarr[i] = ${VAR_TYPE}(coords);\n",0x20);
                lVar20 = 3;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\t\tcoords = coords * 0.5;\n",0x19);
                pcVar21 = "\t}\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar24,pcVar21,lVar20);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar24,"\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n",
                         0x32);
              if (lVar17 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\tres += arr[0];\n",0x10);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\tres += arr[1];\n",0x10);
                lVar20 = 0x10;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\tres += arr[2];\n",0x10);
                pcVar21 = "\tres += arr[3];\n";
              }
              else if (lVar17 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\tres += arr[ui_zero];\n",0x16);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\tres += arr[ui_one];\n",0x15);
                lVar20 = 0x17;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\tres += arr[ui_two];\n",0x15);
                pcVar21 = "\tres += arr[ui_three];\n";
              }
              else {
                lVar20 = 0x11;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,pcVar19,lVar18);
                pcVar21 = "\t\tres += arr[i];\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar24,pcVar21,lVar20);
              if (bVar28 == false) {
                lVar20 = 0x25;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"\tv_coords = a_coords;\n",0x16);
                pcVar21 = "\tgl_FragColor = vec4(res${PADDING});\n";
              }
              else {
                lVar20 = 0x19;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"\tv_color = vec4(res${PADDING});\n",0x20);
                pcVar21 = "\tgl_FragColor = v_color;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar21,lVar20);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"}\n",2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar27);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])0x637a67,(char **)&fragTemplate.m_template);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x63bdf8);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0x67040e,(char (*) [8])0x63a986);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if (DVar27 == TYPE_FLOAT_VEC3) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x636b4d);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (DVar27 == TYPE_FLOAT_VEC2) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x636b48);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (DVar27 == TYPE_FLOAT) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0"
                          );
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [1])"");
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                         (allocator<char> *)&local_400);
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,local_400._M_dataplus._M_p,&local_459);
              tcu::StringTemplate::StringTemplate
                        ((StringTemplate *)&fragTemplate.m_template,&vertexShaderSource);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_400._M_dataplus._M_p != &local_400.field_2) {
                operator_delete(local_400._M_dataplus._M_p,
                                local_400.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize
                        (&local_400,(StringTemplate *)&fragTemplate.m_template,&params);
              if (DVar27 - TYPE_FLOAT < 4) {
                p_Var23 = (ShaderEvalFunc)(&PTR_evalArrayCoordsFloat_007737b0)[DVar27 - TYPE_FLOAT];
              }
              else {
                p_Var23 = (ShaderEvalFunc)0x0;
              }
              pSVar12 = (ShaderIndexingCase *)operator_new(0x130);
              dVar2 = ((byte)~bVar28 & 1) * 2 + 3;
              if (lVar17 != 3 && lVar25 != 3) {
                dVar2 = (deUint32)local_3d8;
              }
              ShaderIndexingCase::ShaderIndexingCase
                        (pSVar12,pCVar1,_Var5._M_p,_Var4._M_p,bVar28,DVar27,p_Var23,dVar2,
                         vertexShaderSource._M_dataplus._M_p,local_400._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_400._M_dataplus._M_p != &local_400.field_2) {
                operator_delete(local_400._M_dataplus._M_p,
                                local_400.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragTemplate.m_template);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&params);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::ios_base::~ios_base(local_148);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              std::ios_base::~ios_base(local_2c8);
              tcu::TestNode::addChild(pTVar9,(TestNode *)pSVar12);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)desc._M_dataplus._M_p != &desc.field_2) {
                operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
              lVar20 = 1;
              bVar30 = bVar28 != false;
              bVar28 = false;
            } while (bVar30);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 4);
          lVar25 = lVar25 + 1;
        } while (lVar25 != 4);
        lVar17 = local_40 + 1;
      } while (lVar17 != 4);
      pTVar9 = (TestNode *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,pCVar1->m_testCtx,"vector_subscript",
                 "Vector subscript indexing.");
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
      pTVar9[1]._vptr_TestNode = (_func_int **)pCVar1;
      tcu::TestNode::addChild((TestNode *)this,pTVar9);
      lVar17 = 0;
      do {
        local_3e0 = (ulong)init::s_vectorTypes[lVar17];
        uVar6 = init::s_vectorTypes[lVar17] - TYPE_FLOAT_VEC2;
        lVar25 = 0;
        do {
          lVar18 = 0;
          do {
            local_3d8 = (&getVectorAccessTypeName(deqp::gles2::Functional::VectorAccessType)::
                          s_names)[lVar18];
            uVar7 = (uint)(lVar18 == 3 || lVar25 == 3);
            bVar28 = true;
            lVar20 = 0;
            do {
              glu::getShaderTypeName
                        (UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices[lVar20]);
              pcVar19 = glu::getDataTypeName((DataType)local_3e0);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar19,(allocator<char> *)&local_400);
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                fragTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              fragTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar11[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
                params._M_t._M_impl._0_8_ = (long *)*plVar11;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar11[1];
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                vertTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              vertTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              _frag = &local_1a8;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                local_1a8 = *plVar15;
                lStack_1a0 = plVar11[3];
              }
              else {
                local_1a8 = *plVar15;
                _frag = (long *)*plVar11;
              }
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
              _vtx = &local_328;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                local_328 = *plVar15;
                lStack_320 = plVar11[3];
              }
              else {
                local_328 = *plVar15;
                _vtx = (long *)*plVar11;
              }
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                name.field_2._M_allocated_capacity = *psVar16;
                name.field_2._8_8_ = plVar11[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar16;
                name._M_dataplus._M_p = (pointer)*plVar11;
              }
              name._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              if (_vtx != &local_328) {
                operator_delete(_vtx,local_328 + 1);
              }
              if (_frag != &local_1a8) {
                operator_delete(_frag,local_1a8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&vertexShaderSource,"Vector subscript access with ","");
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                fragTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              fragTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar11[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
                params._M_t._M_impl._0_8_ = (long *)*plVar11;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar11[1];
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                vertTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              vertTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              _frag = &local_1a8;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                local_1a8 = *plVar15;
                lStack_1a0 = plVar11[3];
              }
              else {
                local_1a8 = *plVar15;
                _frag = (long *)*plVar11;
              }
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
              _vtx = &local_328;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                local_328 = *plVar15;
                lStack_320 = plVar11[3];
              }
              else {
                local_328 = *plVar15;
                _vtx = (long *)*plVar11;
              }
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                desc.field_2._M_allocated_capacity = *psVar16;
                desc.field_2._8_8_ = plVar11[3];
              }
              else {
                desc.field_2._M_allocated_capacity = *psVar16;
                desc._M_dataplus._M_p = (pointer)*plVar11;
              }
              desc._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              if (_vtx != &local_328) {
                operator_delete(_vtx,local_328 + 1);
              }
              if (_frag != &local_1a8) {
                operator_delete(_frag,local_1a8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              _Var5._M_p = name._M_dataplus._M_p;
              _Var4._M_p = desc._M_dataplus._M_p;
              pCVar1 = (this->super_TestCaseGroup).m_context;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              poVar24 = (ostringstream *)&frag;
              if (bVar28) {
                poVar24 = (ostringstream *)&vtx;
              }
              number = glu::getDataTypeScalarSize((DataType)local_3e0);
              pcVar19 = deqp::gls::getIntUniformName(number);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"attribute highp vec4 a_position;\n",0x21);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"attribute highp vec4 a_coords;\n",0x1f);
              if (bVar28 == false) {
                lVar20 = 0x1f;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"varying mediump vec4 v_coords;\n",0x1f);
                pcVar21 = "varying mediump vec4 v_coords;\n";
              }
              else {
                lVar20 = 0x1e;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"varying mediump vec3 v_color;\n",0x1e);
                pcVar21 = "varying mediump vec3 v_color;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar21,lVar20);
              if (uVar7 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"uniform mediump int ui_zero",0x1b);
                if (((1 < (int)number) &&
                    (std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)poVar24,", ui_one",8), number != 2)) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar24,", ui_two",8), 3 < number)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,", ui_three",10);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar24,";\n",2);
              }
              iVar3 = (int)poVar24;
              if (lVar18 == 5 || lVar25 == 5) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"uniform mediump int ",0x14);
                if (pcVar19 == (char *)0x0) {
                  std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)poVar24 + -0x18));
                }
                else {
                  sVar13 = strlen(pcVar19);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,pcVar19,sVar13);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar24,";\n",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"void main()\n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"{\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"\tgl_Position = a_position;\n",0x1b);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"void main()\n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
              pcVar21 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";
              if (bVar28 != false) {
                pcVar21 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar24,pcVar21,0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar24,"\t${PRECISION} ${VAR_TYPE} tmp;\n",0x1f);
              iVar8 = (int)lVar25;
              if (iVar8 == 0) {
                lVar20 = 0x43;
                pcVar21 = "\ttmp = coords.${SWIZZLE} * vec4(1.0, 0.5, 0.25, 0.125).${SWIZZLE};\n";
LAB_002e6906:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,pcVar21,lVar20);
              }
              else if (iVar8 == 2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\ttmp[0] = coords.x;\n",0x14);
                if ((1 < (int)number) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar24,"\ttmp[1] = coords.y * 0.5;\n",0x1a), number != 2)
                   ) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,"\ttmp[2] = coords.z * 0.25;\n",0x1b);
                  lVar20 = 0x1c;
                  pcVar21 = "\ttmp[3] = coords.w * 0.125;\n";
LAB_002e6825:
                  if (3 < number) goto LAB_002e6906;
                }
              }
              else if (iVar8 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\ttmp.x = coords.x;\n",0x13);
                if ((1 < (int)number) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar24,"\ttmp.y = coords.y * 0.5;\n",0x19), number != 2))
                {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,"\ttmp.z = coords.z * 0.25;\n",0x1a);
                  lVar20 = 0x1b;
                  pcVar21 = "\ttmp.w = coords.w * 0.125;\n";
                  goto LAB_002e6825;
                }
              }
              else {
                if (lVar25 != 3) {
                  if (lVar25 == 4) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar24,"\tfor (int i = 0; i < ",0x15);
                    poVar14 = (ostream *)std::ostream::operator<<(poVar24,number);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar24,"\tfor (int i = 0; i < ",0x15);
                    poVar14 = (ostream *)poVar24;
                    if (pcVar19 == (char *)0x0) {
                      std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)poVar24 + -0x18));
                    }
                    else {
                      sVar13 = strlen(pcVar19);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar24,pcVar19,sVar13);
                    }
                  }
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"; i++)\n",7);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar24,"\t{\n",3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,"\t\ttmp[i] = coords.x;\n",0x15);
                  lVar20 = 3;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,"\t\tcoords = coords.${ROT_SWIZZLE} * 0.5;\n",0x28);
                  pcVar21 = "\t}\n";
                  goto LAB_002e6906;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\ttmp[ui_zero]  = coords.x;\n",0x1b);
                if ((1 < (int)number) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar24,"\ttmp[ui_one]   = coords.y * 0.5;\n",0x21),
                   number != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,"\ttmp[ui_two]   = coords.z * 0.25;\n",0x22);
                  lVar20 = 0x23;
                  pcVar21 = "\ttmp[ui_three] = coords.w * 0.125;\n";
                  goto LAB_002e6825;
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar24,"\t${PRECISION} float res = 0.0;\n",0x1f);
              iVar8 = (int)lVar18;
              if (iVar8 == 0) {
                lVar20 = 0x23;
                pcVar19 = "\tres = dot(tmp, ${VAR_TYPE}(1.0));\n";
LAB_002e6b13:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,pcVar19,lVar20);
              }
              else if (iVar8 == 2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\tres += tmp[0];\n",0x10);
                if ((1 < (int)number) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar24,"\tres += tmp[1];\n",0x10), number != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,"\tres += tmp[2];\n",0x10);
                  lVar20 = 0x10;
                  pcVar19 = "\tres += tmp[3];\n";
LAB_002e6a6f:
                  if (3 < number) goto LAB_002e6b13;
                }
              }
              else if (iVar8 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\tres += tmp.x;\n",0xf);
                if ((1 < (int)number) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar24,"\tres += tmp.y;\n",0xf), number != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,"\tres += tmp.z;\n",0xf);
                  lVar20 = 0xf;
                  pcVar19 = "\tres += tmp.w;\n";
                  goto LAB_002e6a6f;
                }
              }
              else {
                if (lVar18 != 3) {
                  if (lVar18 == 4) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar24,"\tfor (int i = 0; i < ",0x15);
                    poVar14 = (ostream *)std::ostream::operator<<(poVar24,number);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar24,"\tfor (int i = 0; i < ",0x15);
                    poVar14 = (ostream *)poVar24;
                    if (pcVar19 == (char *)0x0) {
                      std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)poVar24 + -0x18));
                    }
                    else {
                      sVar13 = strlen(pcVar19);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar24,pcVar19,sVar13);
                    }
                  }
                  lVar20 = 0x11;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"; i++)\n",7);
                  pcVar19 = "\t\tres += tmp[i];\n";
                  goto LAB_002e6b13;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\tres += tmp[ui_zero];\n",0x16);
                if ((1 < (int)number) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar24,"\tres += tmp[ui_one];\n",0x15), number != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,"\tres += tmp[ui_two];\n",0x15);
                  lVar20 = 0x17;
                  pcVar19 = "\tres += tmp[ui_three];\n";
                  goto LAB_002e6a6f;
                }
              }
              if (bVar28 == false) {
                lVar20 = 0x26;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"\tv_coords = a_coords;\n",0x16);
                pcVar19 = "\tgl_FragColor = vec4(vec3(res), 1.0);\n";
              }
              else {
                lVar20 = 0x24;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"\tv_color = vec3(res);\n",0x16);
                pcVar19 = "\tgl_FragColor = vec4(v_color, 1.0);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar19,lVar20);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"}\n",2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName((DataType)local_3e0);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])0x637a67,(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0x67040e,(char (*) [8])0x63a986);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_*&,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])0x637343,
                         (char **)(createVectorSubscriptCase(deqp::gles2::Context&,char_const*,char_const*,bool,glu::DataType,deqp::gles2::Functional::VectorAccessType,deqp::gles2::Functional::VectorAccessType)
                                   ::s_swizzles + (long)(int)number * 8));
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[12],_const_char_*&,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [12])"ROT_SWIZZLE",
                         (char **)(createVectorSubscriptCase(deqp::gles2::Context&,char_const*,char_const*,bool,glu::DataType,deqp::gles2::Functional::VectorAccessType,deqp::gles2::Functional::VectorAccessType)
                                   ::s_rotSwizzles + (long)(int)number * 8));
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                         (allocator<char> *)&local_400);
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,local_400._M_dataplus._M_p,&local_459);
              tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_400._M_dataplus._M_p != &local_400.field_2) {
                operator_delete(local_400._M_dataplus._M_p,
                                local_400.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize(&local_400,&fragTemplate,&params);
              if (uVar6 < 3) {
                p_Var23 = (ShaderEvalFunc)(&PTR_evalSubscriptVec2_007737d0)[uVar6];
              }
              else {
                p_Var23 = (ShaderEvalFunc)0x0;
              }
              pSVar12 = (ShaderIndexingCase *)operator_new(0x130);
              dVar2 = ((byte)~bVar28 & 1) * 2 + 3;
              if (lVar18 != 5 && lVar25 != 5) {
                dVar2 = uVar7;
              }
              ShaderIndexingCase::ShaderIndexingCase
                        (pSVar12,pCVar1,_Var5._M_p,_Var4._M_p,bVar28,(DataType)local_3e0,p_Var23,
                         dVar2,vertexShaderSource._M_dataplus._M_p,local_400._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_400._M_dataplus._M_p != &local_400.field_2) {
                operator_delete(local_400._M_dataplus._M_p,
                                local_400.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::~StringTemplate(&fragTemplate);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&params._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::ios_base::~ios_base(local_148);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              std::ios_base::~ios_base(local_2c8);
              tcu::TestNode::addChild(pTVar9,(TestNode *)pSVar12);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)desc._M_dataplus._M_p != &desc.field_2) {
                operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
              lVar20 = 1;
              bVar30 = bVar28 != false;
              bVar28 = false;
            } while (bVar30);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 6);
          lVar25 = lVar25 + 1;
        } while (lVar25 != 6);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      pTVar9 = (TestNode *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,pCVar1->m_testCtx,"matrix_subscript",
                 "Matrix subscript indexing.");
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00772800;
      pTVar9[1]._vptr_TestNode = (_func_int **)pCVar1;
      tcu::TestNode::addChild((TestNode *)this,pTVar9);
      local_360 = 0;
      do {
        DVar27 = init::s_matrixTypes[local_360];
        lVar17 = 0;
        do {
          lVar25 = 0;
          do {
            local_3e0 = (&getIndexAccessTypeName(deqp::gles2::Functional::IndexAccessType)::s_names)
                        [lVar25];
            local_3d8 = CONCAT44(local_3d8._4_4_,(uint)(lVar25 == 1 || lVar17 == 1));
            bVar28 = true;
            lVar18 = 0;
            do {
              glu::getShaderTypeName
                        (UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices[lVar18]);
              pcVar19 = glu::getDataTypeName(DVar27);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar19,(allocator<char> *)&local_400);
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                fragTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              fragTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar11[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
                params._M_t._M_impl._0_8_ = (long *)*plVar11;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar11[1];
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                vertTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              vertTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              _frag = &local_1a8;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                local_1a8 = *plVar15;
                lStack_1a0 = plVar11[3];
              }
              else {
                local_1a8 = *plVar15;
                _frag = (long *)*plVar11;
              }
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
              _vtx = &local_328;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                local_328 = *plVar15;
                lStack_320 = plVar11[3];
              }
              else {
                local_328 = *plVar15;
                _vtx = (long *)*plVar11;
              }
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                name.field_2._M_allocated_capacity = *psVar16;
                name.field_2._8_8_ = plVar11[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar16;
                name._M_dataplus._M_p = (pointer)*plVar11;
              }
              name._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              if (_vtx != &local_328) {
                operator_delete(_vtx,local_328 + 1);
              }
              if (_frag != &local_1a8) {
                operator_delete(_frag,local_1a8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&vertexShaderSource,"Vector subscript access with ","");
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                fragTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              fragTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar11[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar15;
                params._M_t._M_impl._0_8_ = (long *)*plVar11;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar11[1];
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                vertTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar16;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              vertTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              _frag = &local_1a8;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                local_1a8 = *plVar15;
                lStack_1a0 = plVar11[3];
              }
              else {
                local_1a8 = *plVar15;
                _frag = (long *)*plVar11;
              }
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
              _vtx = &local_328;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                local_328 = *plVar15;
                lStack_320 = plVar11[3];
              }
              else {
                local_328 = *plVar15;
                _vtx = (long *)*plVar11;
              }
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar16) {
                desc.field_2._M_allocated_capacity = *psVar16;
                desc.field_2._8_8_ = plVar11[3];
              }
              else {
                desc.field_2._M_allocated_capacity = *psVar16;
                desc._M_dataplus._M_p = (pointer)*plVar11;
              }
              desc._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              if (_vtx != &local_328) {
                operator_delete(_vtx,local_328 + 1);
              }
              if (_frag != &local_1a8) {
                operator_delete(_frag,local_1a8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              _Var5._M_p = name._M_dataplus._M_p;
              _Var4._M_p = desc._M_dataplus._M_p;
              pCVar1 = (this->super_TestCaseGroup).m_context;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              poVar24 = (ostringstream *)&frag;
              if (bVar28) {
                poVar24 = (ostringstream *)&vtx;
              }
              uVar6 = glu::getDataTypeMatrixNumRows(DVar27);
              pcVar19 = deqp::gls::getIntUniformName(uVar6);
              dataType = glu::getDataTypeFloatVec(uVar6);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"attribute highp vec4 a_position;\n",0x21);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"attribute highp vec4 a_coords;\n",0x1f);
              if (bVar28 == false) {
                lVar18 = 0x1f;
                pcVar21 = "varying mediump vec4 v_coords;\n";
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"varying mediump vec4 v_coords;\n",0x1f);
              }
              else {
                lVar18 = 0x1e;
                pcVar21 = "varying mediump vec4 v_color;\n";
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"varying mediump vec4 v_color;\n",0x1e);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar21,lVar18);
              if ((deUint32)local_3d8 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"uniform mediump int ui_zero",0x1b);
                if (((1 < (int)uVar6) &&
                    (std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)poVar24,", ui_one",8), uVar6 != 2)) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar24,", ui_two",8), 3 < uVar6)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,", ui_three",10);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar24,";\n",2);
              }
              iVar3 = (int)poVar24;
              if (lVar25 == 3 || lVar17 == 3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"uniform mediump int ",0x14);
                if (pcVar19 == (char *)0x0) {
                  std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)poVar24 + -0x18));
                }
                else {
                  sVar13 = strlen(pcVar19);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,pcVar19,sVar13);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar24,";\n",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"void main()\n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"{\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"\tgl_Position = a_position;\n",0x1b);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"void main()\n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
              pcVar21 = "\t${PRECISION} vec4 coords = v_coords;\n";
              if (bVar28 != false) {
                pcVar21 = "\t${PRECISION} vec4 coords = a_coords;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar24,pcVar21,0x26);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar24,"\t${PRECISION} ${MAT_TYPE} tmp;\n",0x1f);
              if (lVar17 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\ttmp[0] = ${VEC_TYPE}(coords);\n",0x1f);
                if ((1 < (int)uVar6) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar24,"\ttmp[1] = ${VEC_TYPE}(coords.yzwx) * 0.5;\n",
                               0x2a), uVar6 != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,"\ttmp[2] = ${VEC_TYPE}(coords.zwxy) * 0.25;\n",0x2b
                            );
                  lVar18 = 0x2c;
                  pcVar21 = "\ttmp[3] = ${VEC_TYPE}(coords.wxyz) * 0.125;\n";
LAB_002e7bc2:
                  if (3 < uVar6) goto LAB_002e7ca2;
                }
              }
              else if (lVar17 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\ttmp[ui_zero]  = ${VEC_TYPE}(coords);\n",0x26);
                if ((1 < (int)uVar6) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar24,
                               "\ttmp[ui_one]   = ${VEC_TYPE}(coords.yzwx) * 0.5;\n",0x31),
                   uVar6 != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,
                             "\ttmp[ui_two]   = ${VEC_TYPE}(coords.zwxy) * 0.25;\n",0x32);
                  lVar18 = 0x33;
                  pcVar21 = "\ttmp[ui_three] = ${VEC_TYPE}(coords.wxyz) * 0.125;\n";
                  goto LAB_002e7bc2;
                }
              }
              else {
                if (lVar17 == 2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,"\tfor (int i = 0; i < ",0x15);
                  poVar14 = (ostream *)std::ostream::operator<<(poVar24,uVar6);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,"\tfor (int i = 0; i < ",0x15);
                  poVar14 = (ostream *)poVar24;
                  if (pcVar19 == (char *)0x0) {
                    std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)poVar24 + -0x18));
                  }
                  else {
                    sVar13 = strlen(pcVar19);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar24,pcVar19,sVar13);
                  }
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"; i++)\n",7);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar24,"\t{\n",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\t\ttmp[i] = ${VEC_TYPE}(coords);\n",0x20);
                lVar18 = 3;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\t\tcoords = coords.yzwx * 0.5;\n",0x1e);
                pcVar21 = "\t}\n";
LAB_002e7ca2:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,pcVar21,lVar18);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar24,"\t${PRECISION} ${VEC_TYPE} res = ${VEC_TYPE}(0.0);\n",
                         0x32);
              if (lVar25 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\tres += tmp[0];\n",0x10);
                if ((1 < (int)uVar6) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar24,"\tres += tmp[1];\n",0x10), uVar6 != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,"\tres += tmp[2];\n",0x10);
                  lVar18 = 0x10;
                  pcVar19 = "\tres += tmp[3];\n";
LAB_002e7d90:
                  if (3 < uVar6) goto LAB_002e7e34;
                }
              }
              else if (lVar25 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,"\tres += tmp[ui_zero];\n",0x16);
                if ((1 < (int)uVar6) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar24,"\tres += tmp[ui_one];\n",0x15), uVar6 != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,"\tres += tmp[ui_two];\n",0x15);
                  lVar18 = 0x17;
                  pcVar19 = "\tres += tmp[ui_three];\n";
                  goto LAB_002e7d90;
                }
              }
              else {
                if (lVar25 == 2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,"\tfor (int i = 0; i < ",0x15);
                  poVar14 = (ostream *)std::ostream::operator<<(poVar24,uVar6);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar24,"\tfor (int i = 0; i < ",0x15);
                  poVar14 = (ostream *)poVar24;
                  if (pcVar19 == (char *)0x0) {
                    std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)poVar24 + -0x18));
                  }
                  else {
                    sVar13 = strlen(pcVar19);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar24,pcVar19,sVar13);
                  }
                }
                lVar18 = 0x11;
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"; i++)\n",7);
                pcVar19 = "\t\tres += tmp[i];\n";
LAB_002e7e34:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar24,pcVar19,lVar18);
              }
              if (bVar28 == false) {
                lVar18 = 0x25;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"\tv_coords = a_coords;\n",0x16);
                pcVar19 = "\tgl_FragColor = vec4(res${PADDING});\n";
              }
              else {
                lVar18 = 0x19;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"\tv_color = vec4(res${PADDING});\n",0x20);
                pcVar19 = "\tgl_FragColor = v_color;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar19,lVar18);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"}\n",2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar27);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])"MAT_TYPE",(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(dataType);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])"VEC_TYPE",(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0x67040e,(char (*) [8])0x63a986);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if (uVar6 == 3) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x636b4d);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (uVar6 == 2) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x636b48);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [1])"");
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                         (allocator<char> *)&local_400);
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,local_400._M_dataplus._M_p,&local_459);
              tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_400._M_dataplus._M_p != &local_400.field_2) {
                operator_delete(local_400._M_dataplus._M_p,
                                local_400.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize(&local_400,&fragTemplate,&params);
              evalFunc = evalSubscriptMat2;
              if (DVar27 != TYPE_FLOAT_MAT2) {
                if (DVar27 == TYPE_FLOAT_MAT4) {
                  evalFunc = evalSubscriptMat4;
                }
                else if (DVar27 == TYPE_FLOAT_MAT3) {
                  evalFunc = evalSubscriptMat3;
                }
                else {
                  evalFunc = (ShaderEvalFunc)0x0;
                }
              }
              pSVar12 = (ShaderIndexingCase *)operator_new(0x130);
              dVar2 = ((byte)~bVar28 & 1) * 2 + 3;
              if (lVar25 != 3 && lVar17 != 3) {
                dVar2 = (deUint32)local_3d8;
              }
              ShaderIndexingCase::ShaderIndexingCase
                        (pSVar12,pCVar1,_Var5._M_p,_Var4._M_p,bVar28,DVar27,evalFunc,dVar2,
                         vertexShaderSource._M_dataplus._M_p,local_400._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_400._M_dataplus._M_p != &local_400.field_2) {
                operator_delete(local_400._M_dataplus._M_p,
                                local_400.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::~StringTemplate(&fragTemplate);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&params._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::ios_base::~ios_base(local_148);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              std::ios_base::~ios_base(local_2c8);
              tcu::TestNode::addChild(pTVar9,(TestNode *)pSVar12);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)desc._M_dataplus._M_p != &desc.field_2) {
                operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
              lVar18 = 1;
              bVar30 = bVar28 != false;
              bVar28 = false;
            } while (bVar30);
            lVar25 = lVar25 + 1;
          } while (lVar25 != 4);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 4);
        local_360 = local_360 + 1;
        if (local_360 == 3) {
          return 1;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void ShaderIndexingTests::init (void)
{
	static const ShaderType s_shaderTypes[] =
	{
		SHADERTYPE_VERTEX,
		SHADERTYPE_FRAGMENT
	};

	static const DataType s_floatAndVecTypes[] =
	{
		TYPE_FLOAT,
		TYPE_FLOAT_VEC2,
		TYPE_FLOAT_VEC3,
		TYPE_FLOAT_VEC4
	};

	// Varying array access cases.
	{
		TestCaseGroup* varyingGroup = new TestCaseGroup(m_context, "varying_array", "Varying array access tests.");
		addChild(varyingGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int vertAccess = 0; vertAccess < INDEXACCESS_LAST; vertAccess++)
			{
				for (int fragAccess = 0; fragAccess < INDEXACCESS_LAST; fragAccess++)
				{
					const char* vertAccessName = getIndexAccessTypeName((IndexAccessType)vertAccess);
					const char* fragAccessName = getIndexAccessTypeName((IndexAccessType)fragAccess);
					string name = string(getDataTypeName(varType)) + "_" + vertAccessName + "_write_" + fragAccessName + "_read";
					string desc = string("Varying array with ") + vertAccessName + " write in vertex shader and " + fragAccessName + " read in fragment shader.";
					varyingGroup->addChild(createVaryingArrayCase(m_context, name.c_str(), desc.c_str(), varType, (IndexAccessType)vertAccess, (IndexAccessType)fragAccess));
				}
			}
		}
	}

	// Uniform array access cases.
	{
		TestCaseGroup* uniformGroup = new TestCaseGroup(m_context, "uniform_array", "Uniform array access tests.");
		addChild(uniformGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
			{
				const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);
				for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
				{
					ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
					const char*	shaderTypeName	= getShaderTypeName(shaderType);
					string		name			= string(getDataTypeName(varType)) + "_" + readAccessName + "_read_" + shaderTypeName;
					string		desc			= string("Uniform array with ") + readAccessName + " read in " + shaderTypeName + " shader.";
					bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
					uniformGroup->addChild(createUniformArrayCase(m_context, name.c_str(), desc.c_str(), isVertexCase, varType, (IndexAccessType)readAccess));
				}
			}
		}
	}

	// Temporary array access cases.
	{
		TestCaseGroup* tmpGroup = new TestCaseGroup(m_context, "tmp_array", "Temporary array access tests.");
		addChild(tmpGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < INDEXACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getIndexAccessTypeName((IndexAccessType)writeAccess);
					const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Temporary array with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						tmpGroup->addChild(createTmpArrayCase(m_context, name.c_str(), desc.c_str(), isVertexCase, varType, (IndexAccessType)writeAccess, (IndexAccessType)readAccess));
					}
				}
			}
		}
	}

	// Vector indexing with subscripts.
	{
		TestCaseGroup* vecGroup = new TestCaseGroup(m_context, "vector_subscript", "Vector subscript indexing.");
		addChild(vecGroup);

		static const DataType s_vectorTypes[] =
		{
			TYPE_FLOAT_VEC2,
			TYPE_FLOAT_VEC3,
			TYPE_FLOAT_VEC4
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_vectorTypes); typeNdx++)
		{
			DataType varType = s_vectorTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < VECTORACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < VECTORACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getVectorAccessTypeName((VectorAccessType)writeAccess);
					const char* readAccessName = getVectorAccessTypeName((VectorAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Vector subscript access with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						vecGroup->addChild(createVectorSubscriptCase(m_context, name.c_str(), desc.c_str(), isVertexCase, varType, (VectorAccessType)writeAccess, (VectorAccessType)readAccess));
					}
				}
			}
		}
	}

	// Matrix indexing with subscripts.
	{
		TestCaseGroup* matGroup = new TestCaseGroup(m_context, "matrix_subscript", "Matrix subscript indexing.");
		addChild(matGroup);

		static const DataType s_matrixTypes[] =
		{
			TYPE_FLOAT_MAT2,
			TYPE_FLOAT_MAT3,
			TYPE_FLOAT_MAT4
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_matrixTypes); typeNdx++)
		{
			DataType varType = s_matrixTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < INDEXACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getIndexAccessTypeName((IndexAccessType)writeAccess);
					const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Vector subscript access with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						matGroup->addChild(createMatrixSubscriptCase(m_context, name.c_str(), desc.c_str(), isVertexCase, varType, (IndexAccessType)writeAccess, (IndexAccessType)readAccess));
					}
				}
			}
		}
	}
}